

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O2

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
::construct_msgs(suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                 *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *param_1,
                vector<unsigned_long,_std::allocator<unsigned_long>_> *param_2,int dist)

{
  comm *comm;
  pointer puVar1;
  ulong uVar2;
  anon_class_64_8_0d7252e9 f;
  size_t sVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  bool cond;
  ulong uVar10;
  unsigned_long uVar11;
  ostream *poVar12;
  long lVar13;
  pointer ptVar14;
  pointer pmVar15;
  pointer puVar16;
  int iVar17;
  unsigned_long uVar18;
  ulong uVar19;
  pointer pTVar20;
  size_t prefix;
  int overlap_type;
  uint local_25c;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> bucket;
  int my_schedule;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> msgs;
  unsigned_long local_218;
  size_t rebucket_offset;
  ulong local_208;
  int left_p;
  _Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_1f8;
  TwoBSA<unsigned_long> tuple;
  size_t unresolved_els;
  _Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_188;
  vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_> out_of_bounds_msgs;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  minqueries;
  vector<unsigned_long,_std::allocator<unsigned_long>_> active_elements;
  unsigned_long local_100;
  size_t unfinished_b;
  unsigned_long range_right;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_d0;
  block_decomposition_buffered<unsigned_long> *local_c8;
  unsigned_long local_c0;
  int *local_b8;
  TwoBSA<unsigned_long> *pTStack_b0;
  suffix_array<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *local_a8;
  size_t *psStack_a0;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *local_98;
  string *psStack_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_88;
  undefined1 *puStack_80;
  section_timer timer;
  
  comm = &this->comm;
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  section_timer_impl(&timer,(ostream *)&std::cerr,(this->comm).mpi_comm,0);
  local_218 = mxx::left_shift<unsigned_long>
                        ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start,comm);
  local_c8 = &this->part;
  prefix = (this->part).prefix;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = 0;
  while (tuple.B1 = uVar10,
        puVar1 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start,
        tuple.B1 <
        (ulong)((long)(param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    uVar11 = puVar1[tuple.B1];
    uVar10 = tuple.B1 + 1;
    if (((uVar11 != prefix + uVar10) ||
        ((uVar19 = this->local_size - 1, tuple.B1 < uVar19 && (puVar1[tuple.B1 + 1] == uVar11)))) ||
       ((tuple.B1 == uVar19 && ((local_218 == uVar11 && ((this->comm).m_rank < this->p + -1)))))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&active_elements,&tuple.B1);
      uVar10 = tuple.B1 + 1;
    }
  }
  std::__cxx11::string::string((string *)&tuple,"get active elements",(allocator *)&range_right);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
            (&timer,(string *)&tuple);
  std::__cxx11::string::~string((string *)&tuple);
  if ((this->comm).m_rank < this->p + -1) {
    puVar1 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_25c = (uint)CONCAT71((int7)((ulong)puVar1 >> 8),puVar1[-1] == local_218);
  }
  else {
    local_25c = 0;
  }
  uVar10 = (ulong)dist;
  local_d0 = &this->local_LCP;
  do {
    puVar1 = active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (this->n <= uVar10) break;
    msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    out_of_bounds_msgs.
    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unresolved_els = 0;
    unfinished_b = 0;
    msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    out_of_bounds_msgs.
    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    out_of_bounds_msgs.
    super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208 = uVar10;
    for (puVar16 = active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar1;
        puVar16 = puVar16 + 1) {
      uVar11 = *puVar16;
      uVar18 = prefix + uVar11;
      tuple.B1 = (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11] + local_208;
      tuple.B2 = uVar18;
      if (tuple.B1 < this->n) {
        std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
        emplace_back<mypair<unsigned_long>>
                  ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)&msgs,
                   (mypair<unsigned_long> *)&tuple);
      }
      else {
        tuple.B1 = 0;
        std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
        emplace_back<mypair<unsigned_long>>
                  ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)
                   &out_of_bounds_msgs,(mypair<unsigned_long> *)&tuple);
      }
      unresolved_els = unresolved_els + 1;
      if ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar11] == uVar18 + 1) {
        unfinished_b = unfinished_b + 1;
      }
    }
    uVar11 = mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&unresolved_els,comm);
    mxx::allreduce<unsigned_long,std::plus<unsigned_long>>(&unfinished_b,comm);
    if ((this->comm).m_rank == 0) {
      poVar12 = std::operator<<((ostream *)&std::cerr,"==== chaising iteration ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12," unresolved = ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::endl<char,std::char_traits<char>>(poVar12);
      poVar12 = std::operator<<((ostream *)&std::cerr,"==== chaising iteration ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12," unfinished = ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::endl<char,std::char_traits<char>>(poVar12);
    }
    if (uVar11 != 0) {
      mxx::
      all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_1_>
                (&msgs,(anon_class_8_1_8991fb9c)this,comm);
      puVar1 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (pmVar15 = msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pmVar15 !=
          msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
          _M_impl.super__Vector_impl_data._M_finish; pmVar15 = pmVar15 + 1) {
        pmVar15->first = puVar1[pmVar15->first - prefix];
      }
      mxx::
      all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_2_>
                (&msgs,(anon_class_8_1_8991fb9c)this,comm);
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>::
        insert<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,void>
                  ((vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>> *)&msgs,
                   (const_iterator)
                   msgs.
                   super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    )out_of_bounds_msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<mypair<unsigned_long>_*,_std::vector<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>_>
                    )out_of_bounds_msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          out_of_bounds_msgs.
          super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        out_of_bounds_msgs.
        super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             out_of_bounds_msgs.
             super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if ((long)msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4 != unresolved_els) {
        __assert_fail("msgs.size() == unresolved_els",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x5be,
                      "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                     );
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<mypair<unsigned_long>*,std::vector<mypair<unsigned_long>,std::allocator<mypair<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&,mypair<unsigned_long>const&)_1_>>
                ();
      bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      minqueries.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      minqueries.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      minqueries.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      overlap_type = 0;
      local_c0 = *(param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start - 1;
      local_100 = 0;
      pmVar15 = msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (pmVar15 !=
             msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        uVar19 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[pmVar15->second - prefix];
        uVar10 = uVar19 - 1;
        if (prefix <= uVar10 && uVar10 != pmVar15->second) {
          __assert_fail("bucket_begin < prefix || bucket_begin == msgit->second",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                        ,0x5dc,
                        "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                       );
        }
        for (; pTVar8 = local_188._M_impl.super__Vector_impl_data._M_end_of_storage,
            pTVar20 = local_188._M_impl.super__Vector_impl_data._M_finish,
            pTVar7 = local_188._M_impl.super__Vector_impl_data._M_start,
            pTVar6 = local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage,
            pTVar5 = local_1f8._M_impl.super__Vector_impl_data._M_finish,
            pTVar4 = local_1f8._M_impl.super__Vector_impl_data._M_start,
            pmVar15 !=
            msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish; pmVar15 = pmVar15 + 1) {
          uVar2 = pmVar15->second;
          lVar13 = uVar2 - prefix;
          puVar1 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar1[lVar13] != uVar19) goto LAB_0013c298;
          if ((uVar2 < prefix) || (prefix + this->local_size <= uVar2)) {
            __assert_fail("msgit->second >= prefix && msgit->second < prefix+local_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x5e1,
                          "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                         );
          }
          tuple.SA = (this->local_SA).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13];
          tuple.B1 = puVar1[lVar13];
          tuple.B2 = pmVar15->first;
          std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::push_back
                    (&bucket,&tuple);
        }
        if ((local_25c & 1) == 0) {
LAB_0013c298:
          if (uVar10 < prefix) {
            overlap_type = overlap_type + 1;
            local_1f8._M_impl.super__Vector_impl_data._M_start =
                 bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_1f8._M_impl.super__Vector_impl_data._M_finish =
                 bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage =
                 bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start = pTVar4;
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = pTVar5;
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar6;
            pTVar20 = pTVar5;
          }
          else {
            std::
            __sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (bucket.
                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       bucket.
                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            if ((uVar10 - prefix != 0) &&
               (uVar19 <= (param_1->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start[(uVar10 - prefix) + -1])) {
              __assert_fail("out_idx == 0 || local_B[out_idx-1] < cur_b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x603,
                            "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                           );
            }
            lVar13 = uVar19 - prefix;
            for (pTVar20 = bucket.
                           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; sVar3 = prefix,
                pTVar20 !=
                bucket.
                super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_finish; pTVar20 = pTVar20 + 1) {
              if (pTVar20 !=
                  bucket.
                  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                uVar10 = pTVar20[-1].B2;
                uVar2 = pTVar20->B2;
                if (uVar10 != uVar2) {
                  range_right = uVar2;
                  tuple.B1 = uVar10;
                  if (uVar2 < uVar10) {
                    range_right = uVar10;
                    tuple.B1 = uVar2;
                  }
                  rebucket_offset = lVar13 + -1 + prefix;
                  std::
                  vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>
                  ::emplace_back<unsigned_long,unsigned_long&,unsigned_long&>
                            ((vector<std::tuple<unsigned_long,unsigned_long,unsigned_long>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_long>>>
                              *)&minqueries,&rebucket_offset,&tuple.B1,&range_right);
                  uVar19 = sVar3 + lVar13;
                }
              }
              (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar13 + -1] = pTVar20->SA;
              (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar13 + -1] = uVar19;
              lVar13 = lVar13 + 1;
            }
            if ((this->local_size + 1 != lVar13) &&
               ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start[lVar13 + -1] - prefix != lVar13)) {
              __assert_fail("out_idx == local_size || local_B[out_idx] == prefix+out_idx+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                            ,0x620,
                            "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                           );
            }
          }
        }
        else {
          if ((this->p + -1 <= (this->comm).m_rank) ||
             ((param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1] != local_218)) {
            __assert_fail("comm.rank() < p-1 && local_B.back() == right_B",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x5eb,
                          "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                         );
          }
          if (uVar10 < prefix) {
            local_1f8._M_impl.super__Vector_impl_data._M_start =
                 bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_1f8._M_impl.super__Vector_impl_data._M_finish =
                 bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage =
                 bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start = pTVar4;
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = pTVar5;
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar6;
            overlap_type = 4;
            pTVar20 = pTVar5;
          }
          else {
            overlap_type = overlap_type + 2;
            local_188._M_impl.super__Vector_impl_data._M_start =
                 bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_188._M_impl.super__Vector_impl_data._M_finish =
                 bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_188._M_impl.super__Vector_impl_data._M_end_of_storage =
                 bucket.
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start = pTVar7;
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = pTVar20;
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = pTVar8;
            local_100 = uVar10 - prefix;
          }
        }
        if (pTVar20 !=
            bucket.
            super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          bucket.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               bucket.
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
      my_schedule = -1;
      if ((this->comm).m_rank == 0) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&tuple,(long)this->p,
                   (allocator_type *)&range_right);
        MPI_Gather(&overlap_type,1,&ompi_mpi_int,tuple.B1,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&range_right,(long)this->p,
                   (allocator_type *)&rebucket_offset);
        iVar17 = 0;
        for (lVar13 = 0; lVar13 < this->p; lVar13 = lVar13 + 1) {
          switch(*(undefined4 *)(tuple.B1 + lVar13 * 4)) {
          case 0:
            *(undefined4 *)(range_right + lVar13 * 4) = 0xffffffff;
            break;
          case 1:
          case 4:
            *(int *)(range_right + lVar13 * 4) = iVar17;
            break;
          case 2:
            *(undefined4 *)(range_right + lVar13 * 4) = 0;
            iVar17 = 0;
            break;
          case 3:
            *(int *)(range_right + lVar13 * 4) = iVar17;
            iVar17 = 1 - iVar17;
            break;
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                          ,0x64d,
                          "void suffix_array<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, unsigned long, true>::construct_msgs(std::vector<index_t> &, std::vector<index_t> &, int) [InputIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, index_t = unsigned long, _CONSTRUCT_LCP = true]"
                         );
          }
        }
        MPI_Scatter(range_right,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,(this->comm).mpi_comm
                   );
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&range_right);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&tuple);
      }
      else {
        MPI_Gather(&overlap_type,1,&ompi_mpi_int,0,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
        MPI_Scatter(0,1,&ompi_mpi_int,&my_schedule,1,&ompi_mpi_int,0,(this->comm).mpi_comm);
      }
      for (iVar17 = 0; iVar17 != 2; iVar17 = iVar17 + 1) {
        std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
                  ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)&tuple,
                   (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                   &local_1f8);
        uVar18 = local_c0;
        left_p = mxx::partition::block_decomposition_buffered<unsigned_long>::target_processor
                           (local_c8,local_c0);
        range_right = 0;
        rebucket_offset = uVar18;
        if (iVar17 == my_schedule || overlap_type != 3) {
          if (overlap_type == 2 && iVar17 == my_schedule) goto LAB_0013c606;
          cond = overlap_type != 0 && iVar17 == my_schedule;
        }
        else {
LAB_0013c606:
          std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator=
                    ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                     &tuple,(vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                             *)&local_188);
          left_p = (this->comm).m_rank;
          range_right = local_100;
          rebucket_offset = prefix + local_100;
          cond = true;
        }
        local_b8 = &left_p;
        pTStack_b0 = &tuple;
        psStack_a0 = &rebucket_offset;
        local_98 = &minqueries;
        f.border_bucket =
             (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)pTStack_b0;
        f.left_p = local_b8;
        f.this = this;
        f.rebucket_offset = psStack_a0;
        f.minqueries = local_98;
        f.bucket_offset = (size_t *)&range_right;
        f.local_B = param_1;
        f.prefix = &prefix;
        local_a8 = this;
        psStack_90 = (string *)&range_right;
        local_88 = param_1;
        puStack_80 = (undefined1 *)&prefix;
        mxx::comm::
        with_subset<suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mxx::comm_const&)_1_>
                  (comm,cond,f);
        mxx::comm::barrier(comm);
        std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
        ~_Vector_base((_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                       *)&tuple);
      }
      local_218 = mxx::left_shift<unsigned_long>
                            ((param_1->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start,comm);
      if ((this->comm).m_rank < this->p + -1) {
        puVar1 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        local_25c = (uint)CONCAT71((int7)((ulong)puVar1 >> 8),puVar1[-1] == local_218);
      }
      else {
        local_25c = 0;
      }
      pmVar15 = msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      for (; pmVar15 !=
             msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; pmVar15 = pmVar15 + 1) {
        tuple.B1 = pmVar15->second - prefix;
        puVar1 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar18 = puVar1[tuple.B1];
        if (((uVar18 != pmVar15->second + 1) ||
            ((uVar10 = this->local_size - 1, tuple.B1 < uVar10 && (puVar1[tuple.B1 + 1] == uVar18)))
            ) || ((tuple.B1 == uVar10 &&
                  ((local_218 == uVar18 && ((this->comm).m_rank < this->p + -1)))))) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&active_elements,&tuple.B1);
        }
      }
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
      section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>
                          *)&tuple,(ostream *)&std::cerr,(this->comm).mpi_comm,0);
      pvVar9 = local_d0;
      bulk_rmq<unsigned_long>(this->n,local_d0,&minqueries,comm);
      puVar1 = (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (ptVar14 = minqueries.
                     super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ptVar14 !=
          minqueries.
          super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ptVar14 = ptVar14 + 1) {
        puVar1[(ptVar14->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl - prefix] =
             (ptVar14->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_unsigned_long>).
             super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
             _M_head_impl + local_208;
      }
      std::__cxx11::string::string
                ((string *)&range_right,"LCP update",(allocator *)&rebucket_offset);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                ((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_> *)
                 &tuple,(string *)&range_right);
      std::__cxx11::string::~string((string *)&range_right);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
      ~section_timer_impl((section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>
                           *)&tuple);
      puVar1 = (this->local_SA).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar16 = (param_1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      for (pmVar15 = msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pmVar15 !=
          msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
          _M_impl.super__Vector_impl_data._M_finish; pmVar15 = pmVar15 + 1) {
        pmVar15->first = puVar1[pmVar15->second - prefix];
        pmVar15->second = puVar16[pmVar15->second - prefix];
      }
      mxx::
      all2all_func<mypair<unsigned_long>,suffix_array<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long,true>::construct_msgs(std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,int)::_lambda(mypair<unsigned_long>const&)_3_>
                (&msgs,(anon_class_8_1_8991fb9c)this,comm);
      puVar1 = (param_2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (pmVar15 = msgs.
                     super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pmVar15 !=
          msgs.super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>.
          _M_impl.super__Vector_impl_data._M_finish; pmVar15 = pmVar15 + 1) {
        puVar1[pmVar15->first - prefix] = pmVar15->second;
      }
      std::__cxx11::string::string
                ((string *)&tuple,"bucket-chaising iteration",(allocator *)&range_right);
      mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::end_section
                (&timer,(string *)&tuple);
      std::__cxx11::string::~string((string *)&tuple);
      std::
      _Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&minqueries.
                       super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                     );
      std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
      ~_Vector_base(&local_188);
      std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
      ~_Vector_base(&local_1f8);
      std::_Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::
      ~_Vector_base(&bucket.
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                   );
    }
    std::_Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::~_Vector_base
              (&out_of_bounds_msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>);
    std::_Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>::~_Vector_base
              (&msgs.
                super__Vector_base<mypair<unsigned_long>,_std::allocator<mypair<unsigned_long>_>_>);
    uVar10 = local_208 * 2;
  } while (uVar11 != 0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&active_elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  mxx::section_timer_impl<std::chrono::duration<double,_std::ratio<1L,_1000L>_>_>::
  ~section_timer_impl(&timer);
  return;
}

Assistant:

void construct_msgs(std::vector<index_t>& local_B, std::vector<index_t>& local_ISA, int dist)
{
    /*
     * Algorithm for few remaining buckets (more communication overhead per
     * element but sends only unfinished buckets -> less data in total if few
     * buckets remaining)
     *
     * INPUT:
     *  - SA in SA order
     *  - B in SA order
     *  - ISA in ISA order (<=> B in ISA order)
     *  - dist: the current dist=2^k, gets doubled after every iteration
     *
     * ALGO:
     * 1.) on i:            send tuple (`to:` Sa[i]+2^k, `from:` i)
     * 2.) on SA[i]+2^k:    return tuple (`to:` i, ISA[SA[i]+2^k])
     * 3.) on i:            for each unfinished bucket:
     *                          sort by new bucket index (2-stage across
     *                          processor boundaries using MPI subcommunicators)
     *                          rebucket into `B`
     * 4.) on i:            send tuple (`to:` SA[i], B[i]) // update bucket numbers in ISA order
     * 5.) on SA[i]:        update ISA[SA[i]] to new B[i]
     *
     */

    SAC_TIMER_START();


    /*
     * 0.) Preparation: need unfinished buckets (info accross proc. boundaries)
     */
    // get next element from right
    index_t right_B = mxx::left_shift(local_B[0], comm);

    // get global offset
    const std::size_t prefix = part.excl_prefix_size();

    // get active elements
    std::vector<index_t> active_elements;
    for (std::size_t j = 0; j < local_B.size(); ++j) {
        // get global index for each local index
        std::size_t i =  prefix + j;
        // check if this is a unresolved bucket
        // relying on the property that for resolved buckets:
        //   B[i] == i+1 and B[i+1] == i+2
        //   (where `i' is the global index)
        if (local_B[j] != i+1 || (local_B[j] == i+1
                    && ((j < local_size-1 && local_B[j+1] == i+1)
                        || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
        {
            // save local active indexes
            active_elements.push_back(j);
        }
    }
    SAC_TIMER_END_SECTION("get active elements");

    bool right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

    for (index_t shift_by = dist; shift_by < n; shift_by <<= 1) {
        /*
         * 1.) on i: send tuple (`to:` Sa[i]+2^k, `from:` i)
         */
        //std::vector<std::pair<index_t, index_t> > msgs;
        //std::vector<std::pair<index_t, index_t> > out_of_bounds_msgs;
        std::vector<mypair<index_t> > msgs;
        std::vector<mypair<index_t> > out_of_bounds_msgs;
        // linear scan for bucket boundaries
        // and create tuples/pairs
        std::size_t unresolved_els = 0;
        std::size_t unfinished_b = 0;
        for (index_t j : active_elements) {
            // get global index for each local index
            std::size_t i =  prefix + j;
            // add tuple
            if (local_SA[j] + shift_by >= n)
                //out_of_bounds_msgs.push_back(std::make_pair<index_t,index_t>(0, static_cast<index_t>(i)));
                out_of_bounds_msgs.push_back({0, static_cast<index_t>(i)});
            else
                //msgs.push_back(std::make_pair<index_t,index_t>(local_SA[j]+shift_by, static_cast<index_t>(i)));
                msgs.push_back({local_SA[j]+shift_by, static_cast<index_t>(i)});
            unresolved_els++;
            if (local_B[j] == i+1) // if first element of unfinished bucket:
                unfinished_b++;
        }

        // check if all resolved
        std::size_t gl_unresolved = mxx::allreduce(unresolved_els, comm);
        std::size_t gl_unfinished = mxx::allreduce(unfinished_b, comm);
        if (comm.rank() == 0) {
            INFO("==== chaising iteration " << shift_by << " unresolved = " << gl_unresolved);
            INFO("==== chaising iteration " << shift_by << " unfinished = " << gl_unfinished);
        }
        if (gl_unresolved == 0)
            // finished!
            break;

        // message exchange to processor which contains first index
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.first);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // for each message, add the bucket no. into the `first` field
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_ISA[it->first - prefix];
        }


        /*
         * 2.)
         */
        // send messages back to originator
        //msgs_all2all(msgs, [&](const std::pair<index_t, index_t>& x){return part.target_processor(x.second);}, comm);
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.second);}, comm);

        // append the previous out-of-bounds messages (since they all have B2 = 0)
        if (out_of_bounds_msgs.size() > 0)
            msgs.insert(msgs.end(), out_of_bounds_msgs.begin(), out_of_bounds_msgs.end());
        out_of_bounds_msgs.clear();

        assert(msgs.size() == unresolved_els);

        // sort received messages by the target index to enable consecutive
        // scanning of local buckets and messages
        std::sort(msgs.begin(), msgs.end(), [](const mypair<index_t>& x, const mypair<index_t>& y){ return x.second < y.second;});

        /*
         * 3.)
         */
        // building sequence of triplets for each unfinished bucket and sort
        // then rebucket, buckets which spread accross boundaries, sort via
        // MPI sub communicators and samplesort in two phases
        std::vector<TwoBSA<index_t> > bucket;
        std::vector<TwoBSA<index_t> > left_bucket;
        std::vector<TwoBSA<index_t> > right_bucket;

        // prepare LCP queries vector
        std::vector<std::tuple<index_t, index_t, index_t> > minqueries;

        // find bucket boundaries:
        auto msgit = msgs.begin();
        // overlap type:    0: no overlaps, 1: left overlap, 2:right overlap,
        //                  3: separate overlaps on left and right
        //                  4: contiguous overlap with both sides
        int overlap_type = 0; // init to no overlaps
        std::size_t bucket_begin = local_B[0]-1;
        std::size_t first_bucket_begin = bucket_begin;
        std::size_t right_bucket_offset = 0;
        while (msgit != msgs.end()) {
            bucket_begin = local_B[msgit->second - prefix]-1;
            assert(bucket_begin < prefix || bucket_begin == msgit->second);

            // find end of bucket
            while (msgit != msgs.end() && local_B[msgit->second - prefix]-1 == bucket_begin) {
                TwoBSA<index_t> tuple;
                assert(msgit->second >= prefix && msgit->second < prefix+local_size);
                tuple.SA = local_SA[msgit->second - prefix];
                tuple.B1 = local_B[msgit->second - prefix];
                tuple.B2 = msgit->first;
                bucket.push_back(tuple);
                msgit++;
            }

            // get bucket end (could be on other processor)
            if (msgit == msgs.end() && right_bucket_crosses_proc) {
                assert(comm.rank() < p-1 && local_B.back() == right_B);
                if (bucket_begin >= prefix)
                {
                    overlap_type += 2;
                    right_bucket.swap(bucket);
                    right_bucket_offset = bucket_begin - prefix;
                }
                else
                {
                    // bucket extends to left AND right
                    left_bucket.swap(bucket);
                    overlap_type = 4;
                }
            } else {
                if (bucket_begin >= prefix)
                {
                    // this is a local bucket => sort by B2, rebucket, and save
                    // TODO custom comparison that only sorts by B2, not by B1 as well
                    std::sort(bucket.begin(), bucket.end());
                    // local rebucket
                    // save back into local_B, local_SA, etc
                    index_t cur_b = bucket_begin + 1;
                    std::size_t out_idx = bucket_begin - prefix;
                    // assert previous bucket index is smaller
                    assert(out_idx == 0 || local_B[out_idx-1] < cur_b);
                    for (auto it = bucket.begin(); it != bucket.end(); ++it)
                    {
                        // if this is a new bucket, then update number
                        if (it != bucket.begin() && (it-1)->B2 != it->B2)
                        {
                            // update bucket index
                            cur_b = out_idx + prefix + 1;

                            if (_CONSTRUCT_LCP)
                            {
                                // add as query item for LCP construction
                                index_t left_b  = std::min((it-1)->B2, it->B2);
                                index_t right_b = std::max((it-1)->B2, it->B2);
                                // we need the minumum LCP of all suffixes in buckets between
                                // these two buckets. Since the first element in the left bucket
                                // is the LCP of this bucket with its left bucket and we don't need
                                // this LCP value, start one to the right:
                                // (-1 each since buffer numbers are current index + 1)
                                index_t range_left = (left_b-1) + 1;
                                index_t range_right = (right_b-1) + 1; // +1 since exclusive index
                                minqueries.emplace_back(out_idx + prefix, range_left, range_right);
                            }
                        }
                        local_SA[out_idx] = it->SA;
                        local_B[out_idx] = cur_b;
                        out_idx++;
                    }
                    // assert next bucket index is larger
                    assert(out_idx == local_size || local_B[out_idx] == prefix+out_idx+1);
                }
                else
                {
                    overlap_type += 1;
                    left_bucket.swap(bucket);
                }
            }
            bucket.clear();
        }

        // if we have left/right/both/or double buckets, do global comm in two phases
        int my_schedule = -1;
        if (comm.rank() == 0) {
            // gather all types to first processor
            std::vector<int> overlaps(p);
            MPI_Gather(&overlap_type, 1, MPI_INT, &overlaps[0], 1, MPI_INT, 0, comm);

            // create schedule using linear scan over the overlap types
            std::vector<int> schedule(p);
            int phase = 0; // start in first phase
            for (int i = 0; i < p; ++i) {
                switch (overlaps[i]) {
                    case 0:
                        schedule[i] = -1; // doesn't matter
                        break;
                    case 1:
                        // only left overlap -> participate in current phase
                        schedule[i] = phase;
                        break;
                    case 2:
                        // only right overlap, start with phase 0
                        phase = 0;
                        schedule[i] = phase;
                        break;
                    case 3:
                        // separate overlaps left and right -> switch phase
                        schedule[i] = phase; // left overlap starts with current phase
                        phase = 1 - phase;
                        break;
                    case 4:
                        // overlap with both: left and right => keep phase
                        schedule[i] = phase;
                        break;
                    default:
                        assert(false);
                        break;
                }
            }

            // scatter the schedule to the processors
            MPI_Scatter(&schedule[0], 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        } else {
            // send out my overlap type
            MPI_Gather(&overlap_type, 1, MPI_INT, NULL, 1, MPI_INT, 0, comm);

            // ... let master processor solve the schedule

            // receive schedule:
            MPI_Scatter(NULL, 1, MPI_INT, &my_schedule, 1, MPI_INT, 0, comm);
        }


        // two phase sorting across boundaries using sub communicators
        for (int phase = 0; phase <= 1; ++phase) {
            std::vector<TwoBSA<index_t> > border_bucket = left_bucket;
            // the leftmost processor of a group will be used as split
            int left_p = part.target_processor(first_bucket_begin);
            bool participate = (overlap_type != 0 && my_schedule == phase);
            std::size_t bucket_offset = 0; // left bucket starts from beginning
            std::size_t rebucket_offset = first_bucket_begin;
            if ((my_schedule != phase && overlap_type == 3) || (my_schedule == phase && overlap_type == 2)) {
                // starting a bucket at the end
                border_bucket = right_bucket;
                left_p = comm.rank();
                participate = true;
                bucket_offset = right_bucket_offset;
                rebucket_offset = prefix + bucket_offset;
            }

            comm.with_subset(participate,[&](const mxx::comm& sc) {
                // split communicator to `left_p`
                mxx::comm subcomm = sc.split(left_p);

                // sample sort the bucket with arbitrary distribution
                mxx::sort(border_bucket.begin(), border_bucket.end(), subcomm);

#ifndef NDEBUG
                index_t first_bucket = border_bucket[0].B1;
#endif
                // rebucket with global offset of first -> in tuple form (also updates LCP)
                rebucket_tuples(border_bucket, subcomm, rebucket_offset, minqueries);
                // assert first bucket index remains the same
                assert(subcomm.rank() != 0 || first_bucket == border_bucket[0].B1);

                // save into full array (if this was left -> save to beginning)
                // (else, need offset of last)
                assert(bucket_offset == 0 || local_B[bucket_offset-1] < border_bucket[0].B1);
                assert(bucket_offset+border_bucket.size() <= local_size);
                for (std::size_t i = 0; i < border_bucket.size(); ++i) {
                    local_SA[i+bucket_offset] = border_bucket[i].SA;
                    local_B[i+bucket_offset] = border_bucket[i].B1;
                }
                assert(bucket_offset+border_bucket.size() == local_size || (local_B[bucket_offset+border_bucket.size()] > local_B[bucket_offset+border_bucket.size()-1]));
                assert(subcomm.rank() != 0 || local_B[bucket_offset] == bucket_offset+prefix+1);

                /*
                 * LCP update
                 */
                // LCP is updated in the custom `rebucket_tuples` function
            });

            comm.barrier();
        }


        // get new bucket number to the right
        right_B = mxx::left_shift(local_B[0], comm);
        // check if right bucket still goes over boundary
        right_bucket_crosses_proc = (comm.rank() < p-1 && local_B.back() == right_B);

        // remember all the remaining active elements
        active_elements.clear();
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            index_t j = it->second - prefix;
            index_t i = it->second;
            // check if this is a unresolved bucket
            // relying on the property that for resolved buckets:
            //   B[i] == i+1 and B[i+1] == i+2
            //   (where `i' is the global index)
            if (local_B[j] != i+1 || (local_B[j] == i+1
                        && ((j < local_size-1 && local_B[j+1] == i+1)
                            || (j == local_size-1 && comm.rank() < p-1 && right_B == i+1))))
            {
                // save local active indexes
                active_elements.push_back(j);
            }
        }

        /*
         * 4.1)   Update LCP
         */
        if (_CONSTRUCT_LCP) {
            // time LCP separately!
            SAC_TIMER_START();
            // get parallel-distributed RMQ for all queries, results are in
            // `minqueries`
            // TODO: bulk updatable RMQs [such that we don't have to construct the
            //       RMQ for the local_LCP in each iteration]
            bulk_rmq(n, local_LCP, minqueries, comm);

            // update the new LCP values:
            for (auto min_lcp : minqueries) {
                local_LCP[std::get<0>(min_lcp) - prefix] = shift_by + std::get<2>(min_lcp);
            }
            SAC_TIMER_END_SECTION("LCP update");
        }

        /*
         * 4.2)  Update ISA
         */
        // message new bucket numbers to new SA[i] for all previously unfinished
        // buckets
        // since the message array is still available with the indices of unfinished
        // buckets -> reuse that information => no need to rescan the whole
        // local array
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            it->first = local_SA[it->second - prefix]; // SA[i]
            it->second = local_B[it->second - prefix]; // B[i]
        }

        // message exchange to processor which contains first index
        mxx::all2all_func(msgs, [&](const mypair<index_t>& x){return part.target_processor(x.first);}, comm);

        // update local ISA with new bucket numbers
        for (auto it = msgs.begin(); it != msgs.end(); ++it) {
            local_ISA[it->first-prefix] = it->second;
        }
        SAC_TIMER_END_SECTION("bucket-chaising iteration");
    }
}